

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_set_serializer.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 local_2c;
  undefined8 uStack_28;
  myinfo userdata;
  json_object *my_sub_object;
  json_object *my_object;
  char **argv_local;
  int argc_local;
  
  printf("Test setting, then resetting a custom serializer:\n");
  uVar1 = json_object_new_object();
  uVar2 = json_object_new_int(0xc);
  json_object_object_add(uVar1,"abc",uVar2);
  uVar2 = json_object_new_string("bar");
  json_object_object_add(uVar1,"foo",uVar2);
  uVar2 = json_object_to_json_string(uVar1);
  printf("my_object.to_string(standard)=%s\n",uVar2);
  local_2c = 0x7b;
  json_object_set_serializer(uVar1,custom_serializer,&local_2c,freeit);
  uVar2 = json_object_to_json_string(uVar1);
  printf("my_object.to_string(custom serializer)=%s\n",uVar2);
  printf("Next line of output should be from the custom freeit function:\n");
  freeit_was_called = 0;
  json_object_set_serializer(uVar1,0,0);
  if (freeit_was_called == 0) {
    __assert_fail("freeit_was_called",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_serializer.c"
                  ,0x34,"int main(int, char **)");
  }
  uVar2 = json_object_to_json_string(uVar1);
  printf("my_object.to_string(standard)=%s\n",uVar2);
  json_object_put(uVar1);
  uVar1 = json_object_new_object();
  printf("Check that the custom serializer isn\'t free\'d until the last json_object_put:\n");
  json_object_set_serializer(uVar1,custom_serializer,&local_2c,freeit);
  json_object_get(uVar1);
  json_object_put(uVar1);
  uVar2 = json_object_to_json_string(uVar1);
  printf("my_object.to_string(custom serializer)=%s\n",uVar2);
  printf("Next line of output should be from the custom freeit function:\n");
  freeit_was_called = 0;
  json_object_put(uVar1);
  if (freeit_was_called != 0) {
    uVar1 = json_object_new_object();
    uStack_28 = json_object_new_double(0x3ff0000000000000);
    json_object_object_add(uVar1,"double",uStack_28);
    printf("Check that the custom serializer does not include nul byte:\n");
    json_object_set_serializer(uStack_28,json_object_double_to_json_string,"%125.0f",0);
    uVar2 = json_object_to_json_string_ext(uVar1,4);
    printf("my_object.to_string(custom serializer)=%s\n",uVar2);
    json_object_put(uVar1);
    return 0;
  }
  __assert_fail("freeit_was_called",
                "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test_set_serializer.c"
                ,0x47,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv)
{
	json_object *my_object, *my_sub_object;

	MC_SET_DEBUG(1);

	printf("Test setting, then resetting a custom serializer:\n");
	my_object = json_object_new_object();
	json_object_object_add(my_object, "abc", json_object_new_int(12));
	json_object_object_add(my_object, "foo", json_object_new_string("bar"));

	printf("my_object.to_string(standard)=%s\n", json_object_to_json_string(my_object));

	struct myinfo userdata = {.value = 123};
	json_object_set_serializer(my_object, custom_serializer, &userdata, freeit);

	printf("my_object.to_string(custom serializer)=%s\n",
	       json_object_to_json_string(my_object));

	printf("Next line of output should be from the custom freeit function:\n");
	freeit_was_called = 0;
	json_object_set_serializer(my_object, NULL, NULL, NULL);
	assert(freeit_was_called);

	printf("my_object.to_string(standard)=%s\n", json_object_to_json_string(my_object));

	json_object_put(my_object);

	// ============================================

	my_object = json_object_new_object();
	printf("Check that the custom serializer isn't free'd until the last json_object_put:\n");
	json_object_set_serializer(my_object, custom_serializer, &userdata, freeit);
	json_object_get(my_object);
	json_object_put(my_object);
	printf("my_object.to_string(custom serializer)=%s\n",
	       json_object_to_json_string(my_object));
	printf("Next line of output should be from the custom freeit function:\n");

	freeit_was_called = 0;
	json_object_put(my_object);
	assert(freeit_was_called);

	// ============================================

	my_object = json_object_new_object();
	my_sub_object = json_object_new_double(1.0);
	json_object_object_add(my_object, "double", my_sub_object);
	printf("Check that the custom serializer does not include nul byte:\n");
#define UNCONST(a) ((void *)(uintptr_t)(const void *)(a))
	json_object_set_serializer(my_sub_object, json_object_double_to_json_string, UNCONST("%125.0f"), NULL);
	printf("my_object.to_string(custom serializer)=%s\n",
	       json_object_to_json_string_ext(my_object, JSON_C_TO_STRING_NOZERO));

	json_object_put(my_object);

	return 0;
}